

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

void __thiscall icu_63::LocaleDisplayNamesImpl::initialize(LocaleDisplayNamesImpl *this)

{
  UBool UVar1;
  int32_t iVar2;
  Locale *this_00;
  Locale *other;
  char *localeID;
  UResourceBundle *pUVar3;
  BreakIterator *pBVar4;
  Locale *local_1f8;
  undefined1 local_1e0 [8];
  CapitalizationContextSink sink;
  LocalPointerBase<UResourceBundle> local_1c0;
  LocalUResourceBundlePointer resource;
  undefined1 local_1b0 [7];
  UBool needBrkIter;
  undefined1 local_170 [8];
  UnicodeString ktPattern;
  undefined1 local_f0 [8];
  UnicodeString pattern;
  undefined1 local_a8 [4];
  UErrorCode status;
  undefined1 local_58 [8];
  UnicodeString sep;
  LocaleDisplayNamesImpl *nonConstThis;
  LocaleDisplayNamesImpl *this_local;
  
  sep.fUnion._48_8_ = this;
  this_00 = ICUDataTable::getLocale(&this->langData);
  other = Locale::getRoot();
  UVar1 = Locale::operator==(this_00,other);
  if (UVar1 == '\0') {
    local_1f8 = ICUDataTable::getLocale(&this->langData);
  }
  else {
    local_1f8 = ICUDataTable::getLocale(&this->regionData);
  }
  Locale::operator=((Locale *)(sep.fUnion._48_8_ + 8),local_1f8);
  UnicodeString::UnicodeString((UnicodeString *)local_58);
  ICUDataTable::getNoFallback
            (&this->langData,"localeDisplayPattern","separator",(UnicodeString *)local_58);
  UVar1 = UnicodeString::isBogus((UnicodeString *)local_58);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_a8,"{0}, {1}",-1,kInvariant);
    UnicodeString::operator=((UnicodeString *)local_58,(UnicodeString *)local_a8);
    UnicodeString::~UnicodeString((UnicodeString *)local_a8);
  }
  pattern.fUnion._52_4_ = 0;
  SimpleFormatter::applyPatternMinMaxArguments
            (&this->separatorFormat,(UnicodeString *)local_58,2,2,
             (UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
  UnicodeString::UnicodeString((UnicodeString *)local_f0);
  ICUDataTable::getNoFallback
            (&this->langData,"localeDisplayPattern","pattern",(UnicodeString *)local_f0);
  UVar1 = UnicodeString::isBogus((UnicodeString *)local_f0);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString
              ((UnicodeString *)((long)&ktPattern.fUnion + 0x30),"{0} ({1})",-1,kInvariant);
    UnicodeString::operator=
              ((UnicodeString *)local_f0,(UnicodeString *)((long)&ktPattern.fUnion + 0x30));
    UnicodeString::~UnicodeString((UnicodeString *)((long)&ktPattern.fUnion + 0x30));
  }
  SimpleFormatter::applyPatternMinMaxArguments
            (&this->format,(UnicodeString *)local_f0,2,2,
             (UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
  iVar2 = UnicodeString::indexOf((UnicodeString *)local_f0,L'（');
  if (iVar2 < 0) {
    UnicodeString::setTo(&this->formatOpenParen,L'(');
    UnicodeString::setTo(&this->formatReplaceOpenParen,L'[');
    UnicodeString::setTo(&this->formatCloseParen,L')');
    UnicodeString::setTo(&this->formatReplaceCloseParen,L']');
  }
  else {
    UnicodeString::setTo(&this->formatOpenParen,L'（');
    UnicodeString::setTo(&this->formatReplaceOpenParen,L'［');
    UnicodeString::setTo(&this->formatCloseParen,L'）');
    UnicodeString::setTo(&this->formatReplaceCloseParen,L'］');
  }
  UnicodeString::UnicodeString((UnicodeString *)local_170);
  ICUDataTable::get(&this->langData,"localeDisplayPattern","keyTypePattern",
                    (UnicodeString *)local_170);
  UVar1 = UnicodeString::isBogus((UnicodeString *)local_170);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_1b0,"{0}={1}",-1,kInvariant);
    UnicodeString::operator=((UnicodeString *)local_170,(UnicodeString *)local_1b0);
    UnicodeString::~UnicodeString((UnicodeString *)local_1b0);
  }
  SimpleFormatter::applyPatternMinMaxArguments
            (&this->keyTypeFormat,(UnicodeString *)local_170,2,2,
             (UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
  memset(this->fCapitalization,0,6);
  resource.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ = '\0';
  if ((this->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) ||
     (this->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE)) {
    localeID = Locale::getName(&this->locale);
    pUVar3 = ures_open_63((char *)0x0,localeID,
                          (UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_1c0,pUVar3);
    UVar1 = ::U_FAILURE(pattern.fUnion._52_4_);
    if (UVar1 == '\0') {
      CapitalizationContextSink::CapitalizationContextSink
                ((CapitalizationContextSink *)local_1e0,this);
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_1c0);
      ures_getAllItemsWithFallback_63
                (pUVar3,"contextTransforms",(ResourceSink *)local_1e0,
                 (UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
      if (pattern.fUnion._52_4_ == 2) {
        pattern.fUnion._52_4_ = 0;
LAB_00321115:
        resource.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ =
             (char)sink.super_ResourceSink.super_UObject._vptr_UObject;
        sink.parent._4_4_ = 0;
      }
      else {
        UVar1 = ::U_FAILURE(pattern.fUnion._52_4_);
        if (UVar1 == '\0') goto LAB_00321115;
        sink.parent._4_4_ = 1;
      }
      CapitalizationContextSink::~CapitalizationContextSink((CapitalizationContextSink *)local_1e0);
    }
    else {
      sink.parent._4_4_ = 1;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_1c0);
    if (sink.parent._4_4_ != 0) goto LAB_00321228;
  }
  if ((resource.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ != '\0') ||
     (this->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE)) {
    pattern.fUnion._52_4_ = 0;
    pBVar4 = BreakIterator::createSentenceInstance
                       (&this->locale,(UErrorCode *)(pattern.fUnion.fStackFields.fBuffer + 0x19));
    this->capitalizationBrkIter = pBVar4;
    UVar1 = ::U_FAILURE(pattern.fUnion._52_4_);
    if (UVar1 != '\0') {
      if (this->capitalizationBrkIter != (BreakIterator *)0x0) {
        (*(this->capitalizationBrkIter->super_UObject)._vptr_UObject[1])();
      }
      this->capitalizationBrkIter = (BreakIterator *)0x0;
    }
  }
  sink.parent._4_4_ = 0;
LAB_00321228:
  UnicodeString::~UnicodeString((UnicodeString *)local_170);
  UnicodeString::~UnicodeString((UnicodeString *)local_f0);
  UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return;
}

Assistant:

void
LocaleDisplayNamesImpl::initialize(void) {
    LocaleDisplayNamesImpl *nonConstThis = (LocaleDisplayNamesImpl *)this;
    nonConstThis->locale = langData.getLocale() == Locale::getRoot()
        ? regionData.getLocale()
        : langData.getLocale();

    UnicodeString sep;
    langData.getNoFallback("localeDisplayPattern", "separator", sep);
    if (sep.isBogus()) {
        sep = UnicodeString("{0}, {1}", -1, US_INV);
    }
    UErrorCode status = U_ZERO_ERROR;
    separatorFormat.applyPatternMinMaxArguments(sep, 2, 2, status);

    UnicodeString pattern;
    langData.getNoFallback("localeDisplayPattern", "pattern", pattern);
    if (pattern.isBogus()) {
        pattern = UnicodeString("{0} ({1})", -1, US_INV);
    }
    format.applyPatternMinMaxArguments(pattern, 2, 2, status);
    if (pattern.indexOf((UChar)0xFF08) >= 0) {
        formatOpenParen.setTo((UChar)0xFF08);         // fullwidth (
        formatReplaceOpenParen.setTo((UChar)0xFF3B);  // fullwidth [
        formatCloseParen.setTo((UChar)0xFF09);        // fullwidth )
        formatReplaceCloseParen.setTo((UChar)0xFF3D); // fullwidth ]
    } else {
        formatOpenParen.setTo((UChar)0x0028);         // (
        formatReplaceOpenParen.setTo((UChar)0x005B);  // [
        formatCloseParen.setTo((UChar)0x0029);        // )
        formatReplaceCloseParen.setTo((UChar)0x005D); // ]
    }

    UnicodeString ktPattern;
    langData.get("localeDisplayPattern", "keyTypePattern", ktPattern);
    if (ktPattern.isBogus()) {
        ktPattern = UnicodeString("{0}={1}", -1, US_INV);
    }
    keyTypeFormat.applyPatternMinMaxArguments(ktPattern, 2, 2, status);

    uprv_memset(fCapitalization, 0, sizeof(fCapitalization));
#if !UCONFIG_NO_BREAK_ITERATION
    // Only get the context data if we need it! This is a const object so we know now...
    // Also check whether we will need a break iterator (depends on the data)
    UBool needBrkIter = FALSE;
    if (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE) {
        LocalUResourceBundlePointer resource(ures_open(NULL, locale.getName(), &status));
        if (U_FAILURE(status)) { return; }
        CapitalizationContextSink sink(*this);
        ures_getAllItemsWithFallback(resource.getAlias(), "contextTransforms", sink, status);
        if (status == U_MISSING_RESOURCE_ERROR) {
            // Silently ignore.  Not every locale has contextTransforms.
            status = U_ZERO_ERROR;
        } else if (U_FAILURE(status)) {
            return;
        }
        needBrkIter = sink.hasCapitalizationUsage;
    }
    // Get a sentence break iterator if we will need it
    if (needBrkIter || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE) {
        status = U_ZERO_ERROR;
        capitalizationBrkIter = BreakIterator::createSentenceInstance(locale, status);
        if (U_FAILURE(status)) {
            delete capitalizationBrkIter;
            capitalizationBrkIter = NULL;
        }
    }
#endif
}